

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

int lyht_find_collision(hash_table *ht,ht_rec **last,ht_rec *first)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ht_rec *__src;
  ht_rec *phVar6;
  uchar *puVar7;
  ht_rec *phVar8;
  
  if ((last == (ht_rec **)0x0) || (phVar6 = *last, phVar6 == (ht_rec *)0x0)) {
    __assert_fail("last && *last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                  ,0x1d1,
                  "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)")
    ;
  }
  uVar2 = phVar6->hash;
  uVar3 = ht->size;
  puVar7 = ht->recs;
  uVar1 = ht->rec_size;
  uVar5 = ((long)phVar6 - (long)puVar7) / (long)(ulong)uVar1;
  phVar6 = (ht_rec *)0x0;
  do {
    uVar5 = (ulong)((int)uVar5 + 1) % (ulong)uVar3;
    __src = (ht_rec *)(puVar7 + (int)uVar5 * (uint)uVar1);
    *last = __src;
    if (__src == first) {
      if (phVar6 == (ht_rec *)0x0) {
        __assert_fail("inval_rec",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                      ,0x1dc,
                      "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)"
                     );
      }
      iVar4 = 1;
LAB_00110603:
      *last = phVar6;
      return iVar4;
    }
    phVar8 = __src;
    if (phVar6 != (ht_rec *)0x0) {
      phVar8 = phVar6;
    }
    iVar4 = __src->hits;
    if (iVar4 != -1) {
      if (iVar4 != 0) {
        phVar8 = phVar6;
        if (((__src->hash ^ uVar2) & uVar3 - 1) != 0) goto LAB_001105c7;
        if (0 < iVar4) {
          if (iVar4 != 1) {
            __assert_fail("(*last)->hits == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/hash_table.c"
                          ,0x1e8,
                          "int lyht_find_collision(struct hash_table *, struct ht_rec **, struct ht_rec *)"
                         );
          }
          if (phVar6 == (ht_rec *)0x0) {
            return 0;
          }
          memcpy(phVar6,__src,(ulong)uVar1);
          (*last)->hits = -1;
          iVar4 = 0;
          goto LAB_00110603;
        }
      }
      iVar4 = 1;
      if (phVar6 == (ht_rec *)0x0) {
        return 1;
      }
      goto LAB_00110603;
    }
LAB_001105c7:
    phVar6 = phVar8;
    puVar7 = ht->recs;
  } while( true );
}

Assistant:

static int
lyht_find_collision(struct hash_table *ht, struct ht_rec **last, struct ht_rec *first)
{
    struct ht_rec *inval_rec = NULL;
    uint32_t i, idx;

    assert(last && *last);

    idx = (*last)->hash & (ht->size - 1);
    i = (((unsigned char *)*last) - ht->recs) / ht->rec_size;

    do {
        i = (i + 1) % ht->size;
        *last = lyht_get_rec(ht->recs, ht->rec_size, i);
        if (*last == first) {
            /* we went through all the records (very unlikely, but possible when many records are invalid),
             * just return an invalid record */
            assert(inval_rec);
            *last = inval_rec;
            return 1;
        }

        if (((*last)->hits == -1) && !inval_rec) {
            inval_rec = *last;
        }
    } while (((*last)->hits != 0) && (((*last)->hits == -1) || (((*last)->hash & (ht->size - 1)) != idx)));

    if ((*last)->hits > 0) {
        /* we found a collision, so move it to the first invalid record so the next search is faster */
        assert((*last)->hits == 1);
        if (inval_rec) {
            memcpy(inval_rec, *last, ht->rec_size);
            (*last)->hits = -1;
            *last = inval_rec;
        }
        return 0;
    }

    /* no next collision found, return the record where it would be inserted */
    if (inval_rec) {
        *last = inval_rec;
    } /* else (*last)->hits == 0, it is already correct */
    return 1;
}